

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_suite.cpp
# Opt level: O0

void from_suite::convert_wstring(void)

{
  bool bVar1;
  any *u;
  type local_98;
  undefined1 local_78 [8];
  variable result;
  allocator<wchar_t> local_31;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_30;
  any local_10;
  any any;
  
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_30,L"bravo",&local_31);
  boost::any::any<std::__cxx11::wstring>(&local_10,&local_30,(type *)0x0,(type *)0x0);
  std::__cxx11::wstring::~wstring((wstring *)&local_30);
  std::allocator<wchar_t>::~allocator(&local_31);
  trial::dynamic::convert::into<trial::dynamic::basic_variable<std::allocator<char>>,boost::any>
            ((basic_variable<std::allocator<char>_> *)local_78,(convert *)&local_10,u);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::wstring>
                    ((basic_variable<std::allocator<char>_> *)local_78);
  boost::detail::test_impl
            ("result.is<wstring>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x98,"void from_suite::convert_wstring()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::wstring>
            (&local_98,(basic_variable<std::allocator<char>> *)local_78);
  bVar1 = std::operator==(&local_98,L"bravo");
  boost::detail::test_impl
            ("result.value<std::wstring>() == L\"bravo\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x99,"void from_suite::convert_wstring()",bVar1);
  std::__cxx11::wstring::~wstring((wstring *)&local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_78);
  boost::any::~any(&local_10);
  return;
}

Assistant:

void convert_wstring()
{
    boost::any any(std::wstring(L"bravo"));
    variable result = convert::into<variable>(any);
    TRIAL_PROTOCOL_TEST(result.is<wstring>());
    TRIAL_PROTOCOL_TEST(result.value<std::wstring>() == L"bravo");
}